

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O1

void tempseat_connection_fatal(Seat *seat,char *message)

{
  __assert_fail("false && \"connection_fatal should never be called on TempSeat\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                ,0x120,"void tempseat_connection_fatal(Seat *, const char *)");
}

Assistant:

static void tempseat_connection_fatal(Seat *seat, const char *message)
{
    /*
     * Fatal errors are another thing a backend should not have any
     * reason to encounter while waiting to hear back about its
     * network connection setup.
     *
     * Also, if a backend _did_ call this, it would be hellish to
     * unpick all the error handling. Just passing on the fatal error
     * to the real Seat wouldn't be good enough: what about freeing
     * all the various things that are confusingly holding pointers to
     * each other? Better to leave this as an assertion-failure level
     * issue, so that if it does ever happen by accident, we'll know
     * it's a bug.
     */
    unreachable("connection_fatal should never be called on TempSeat");
}